

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall QDialogButtonBox::changeEvent(QDialogButtonBox *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  QDialogButtonBoxPrivate *style;
  QWidget *in_RSI;
  QWidget *in_RDI;
  QPushButton *key;
  const_iterator __end3;
  const_iterator __begin3;
  key_container_type *__range3;
  QStyle *newStyle;
  QDialogButtonBoxPrivate *d;
  QDialogButtonBoxPrivate *in_stack_ffffffffffffffc0;
  QWidget *in_stack_ffffffffffffffc8;
  QWidget *in_stack_ffffffffffffffd0;
  
  style = d_func((QDialogButtonBox *)0x66e860);
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if (TVar2 == StyleChange) {
    bVar1 = QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
            ::empty((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
                     *)0x66e88b);
    if (!bVar1) {
      QWidget::style(in_RDI);
      QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
      ::keys(&style->standardButtonMap);
      in_stack_ffffffffffffffd0 =
           (QWidget *)QVLABase<QPushButton_*>::begin((QVLABase<QPushButton_*> *)0x66e8d0);
      in_stack_ffffffffffffffc8 =
           (QWidget *)
           QVLABase<QPushButton_*>::end((QVLABase<QPushButton_*> *)in_stack_ffffffffffffffc0);
      for (; in_stack_ffffffffffffffd0 != in_stack_ffffffffffffffc8;
          in_stack_ffffffffffffffd0 = (QWidget *)&in_stack_ffffffffffffffd0->field_0x8) {
        in_stack_ffffffffffffffc0 = *(QDialogButtonBoxPrivate **)in_stack_ffffffffffffffd0;
        QWidget::setStyle(in_RSI,(QStyle *)style);
      }
    }
    QDialogButtonBoxPrivate::resetLayout(in_stack_ffffffffffffffc0);
    QWidget::changeEvent(in_stack_ffffffffffffffd0,(QEvent *)in_stack_ffffffffffffffc8);
  }
  else {
    QWidget::changeEvent(in_stack_ffffffffffffffd0,(QEvent *)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void QDialogButtonBox::changeEvent(QEvent *event)
{
    Q_D(QDialogButtonBox);
    switch (event->type()) {
    case QEvent::StyleChange:  // Propagate style
        if (!d->standardButtonMap.empty()) {
            QStyle *newStyle = style();
            for (auto key : d->standardButtonMap.keys())
                key->setStyle(newStyle);
        }
#ifdef Q_OS_MAC
        Q_FALLTHROUGH();
    case QEvent::MacSizeChange:
#endif
        d->resetLayout();
        QWidget::changeEvent(event);
        break;
    default:
        QWidget::changeEvent(event);
        break;
    }
}